

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem_pk8.cc
# Opt level: O2

int do_pk8pkey(BIO *bp,EVP_PKEY *x,int isder,int nid,EVP_CIPHER *enc,char *pass,int pass_len,
              pem_password_cb *cb,void *u)

{
  int iVar1;
  PKCS8_PRIV_KEY_INFO *x_00;
  X509_SIG *x_01;
  char buf [1024];
  
  x_00 = EVP_PKEY2PKCS8((EVP_PKEY *)x);
  if (x_00 == (PKCS8_PRIV_KEY_INFO *)0x0) {
    ERR_put_error(9,0,0x6a,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pem/pem_pk8.cc"
                  ,0x45);
    return 0;
  }
  if (nid == -1 && enc == (EVP_CIPHER *)0x0) {
    if (isder == 0) {
      iVar1 = PEM_write_bio_PKCS8_PRIV_KEY_INFO((BIO *)bp,x_00);
    }
    else {
      iVar1 = i2d_PKCS8_PRIV_KEY_INFO_bio((BIO *)bp,x_00);
    }
LAB_0021a62b:
    PKCS8_PRIV_KEY_INFO_free(x_00);
  }
  else {
    if (pass == (char *)0x0) {
      if (cb == (pem_password_cb *)0x0) {
        cb = PEM_def_callback;
      }
      pass = buf;
      pass_len = (*cb)(pass,0x400,1,u);
      if (pass_len < 0) {
        iVar1 = 0;
        ERR_put_error(9,0,0x6f,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pem/pem_pk8.cc"
                      ,0x4f);
        goto LAB_0021a62b;
      }
    }
    x_01 = PKCS8_encrypt(nid,(EVP_CIPHER *)enc,pass,pass_len,(uchar *)0x0,0,0,x_00);
    if (pass == buf) {
      OPENSSL_cleanse(buf,(long)pass_len);
    }
    PKCS8_PRIV_KEY_INFO_free(x_00);
    if (isder == 0) {
      iVar1 = PEM_write_bio_PKCS8((BIO *)bp,x_01);
    }
    else {
      iVar1 = i2d_PKCS8_bio((BIO *)bp,x_01);
    }
    X509_SIG_free(x_01);
  }
  return iVar1;
}

Assistant:

static int do_pk8pkey(BIO *bp, const EVP_PKEY *x, int isder, int nid,
                      const EVP_CIPHER *enc, const char *pass, int pass_len,
                      pem_password_cb *cb, void *u) {
  X509_SIG *p8;
  PKCS8_PRIV_KEY_INFO *p8inf;
  char buf[PEM_BUFSIZE];
  int ret;
  if (!(p8inf = EVP_PKEY2PKCS8(x))) {
    OPENSSL_PUT_ERROR(PEM, PEM_R_ERROR_CONVERTING_PRIVATE_KEY);
    return 0;
  }
  if (enc || (nid != -1)) {
    if (!pass) {
      if (!cb) {
        cb = PEM_def_callback;
      }
      pass_len = cb(buf, PEM_BUFSIZE, 1, u);
      if (pass_len < 0) {
        OPENSSL_PUT_ERROR(PEM, PEM_R_READ_KEY);
        PKCS8_PRIV_KEY_INFO_free(p8inf);
        return 0;
      }

      pass = buf;
    }
    p8 = PKCS8_encrypt(nid, enc, pass, pass_len, NULL, 0, 0, p8inf);
    if (pass == buf) {
      OPENSSL_cleanse(buf, pass_len);
    }
    PKCS8_PRIV_KEY_INFO_free(p8inf);
    if (isder) {
      ret = i2d_PKCS8_bio(bp, p8);
    } else {
      ret = PEM_write_bio_PKCS8(bp, p8);
    }
    X509_SIG_free(p8);
    return ret;
  } else {
    if (isder) {
      ret = i2d_PKCS8_PRIV_KEY_INFO_bio(bp, p8inf);
    } else {
      ret = PEM_write_bio_PKCS8_PRIV_KEY_INFO(bp, p8inf);
    }
    PKCS8_PRIV_KEY_INFO_free(p8inf);
    return ret;
  }
}